

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O2

int report(lua_State *L,int status)

{
  int iVar1;
  char *pcVar2;
  char *msg;
  
  if (status != 0) {
    iVar1 = lua_type(L,-1);
    if (iVar1 != 0) {
      pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
      msg = "(error object is not a string)";
      if (pcVar2 != (char *)0x0) {
        msg = pcVar2;
      }
      l_message(progname,msg);
      lua_settop(L,-2);
    }
  }
  return status;
}

Assistant:

static int report(lua_State *L, int status)
{
  if (status && !lua_isnil(L, -1)) {
    const char *msg = lua_tostring(L, -1);
    if (msg == NULL) msg = "(error object is not a string)";
    l_message(progname, msg);
    lua_pop(L, 1);
  }
  return status;
}